

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

QAction * __thiscall QMenu::exec(QMenu *this,QPoint *p,QAction *action)

{
  long lVar1;
  QAction *pQVar2;
  long in_FS_OFFSET;
  code *pcVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (code *)0x0;
  pQVar2 = QMenuPrivate::exec(*(QMenuPrivate **)&(this->super_QWidget).field_0x8,p,action,
                              (PositionFunction)ZEXT1632(ZEXT816(0)));
  if (pcVar3 != (code *)0x0) {
    (*pcVar3)(&stack0xffffffffffffffc8,&stack0xffffffffffffffc8,3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QAction *QMenu::exec(const QPoint &p, QAction *action)
{
    Q_D(QMenu);
    return d->exec(p, action);
}